

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O0

uchar MX_EQ(uint **a,uint a_rows,uint a_cols,uint **b,uint b_rows,uint b_cols)

{
  uint local_38;
  uint local_34;
  uint j;
  uint i;
  uint b_cols_local;
  uint b_rows_local;
  uint **b_local;
  uint a_cols_local;
  uint a_rows_local;
  uint **a_local;
  
  if (a_rows == b_rows) {
    if (a_cols == b_cols) {
      for (local_34 = 0; local_34 < a_rows; local_34 = local_34 + 1) {
        for (local_38 = 0; local_38 < a_cols; local_38 = local_38 + 1) {
          if (a[local_34][local_38] != b[local_34][local_38]) {
            return '\0';
          }
        }
      }
      a_local._7_1_ = '\x01';
    }
    else {
      a_local._7_1_ = '\0';
    }
  }
  else {
    a_local._7_1_ = '\0';
  }
  return a_local._7_1_;
}

Assistant:

uint8_t MX_EQ(uint32_t **a, uint32_t a_rows, uint32_t a_cols,
          uint32_t **b, uint32_t b_rows, uint32_t b_cols)
{
    if (a_rows != b_rows)
        return 0;
    if (a_cols != b_cols)
        return 0;

    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < a_cols; j++)
            if (a[i][j] != b[i][j])
                return 0;
    return 1;
}